

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::execute_resolver
          (asio_rpc_client *this,ptr<asio_rpc_client> *self,ptr<req_msg> *req,string *host,
          string *port,rpc_handler *when_done,uint64_t send_timeout_ms)

{
  undefined1 local_130 [104];
  string local_c8 [32];
  uint64_t local_a8;
  query q;
  
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query(&q,host,port,all_matching);
  std::__shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)local_130,
             &self->super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>);
  local_130._16_8_ = this;
  std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)(local_130 + 0x18),
             &req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            *)(local_130 + 0x28),when_done);
  std::__cxx11::string::string((string *)(local_130 + 0x48),(string *)host);
  std::__cxx11::string::string(local_c8,(string *)port);
  local_a8 = send_timeout_ms;
  asio::ip::basic_resolver<asio::ip::tcp,asio::any_io_executor>::
  async_resolve<nuraft::asio_rpc_client::execute_resolver(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long)::_lambda(std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)_1_>
            ((basic_resolver<asio::ip::tcp,asio::any_io_executor> *)&this->resolver_,&q,
             (anon_class_144_7_15cfdda5 *)local_130);
  execute_resolver(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long)
  ::{lambda(std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
  ~basic_resolver_iterator
            ((_lambda_std__error_code_asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_ *)
             local_130);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&q);
  return;
}

Assistant:

void execute_resolver(ptr<asio_rpc_client> self,
                          ptr<req_msg> req,
                          const std::string& host,
                          const std::string& port,
                          rpc_handler when_done,
                          uint64_t send_timeout_ms) {
        asio::ip::tcp::resolver::query q
            ( host, port, asio::ip::tcp::resolver::query::all_matching );

        resolver_.async_resolve
        ( q,
          [self, this, req, when_done, host, port, send_timeout_ms]
          ( std::error_code err,
            asio::ip::tcp::resolver::iterator itor ) -> void
        {
            if (!err) {
                asio::async_connect
                    ( socket(),
                      itor,
                      std::bind( &asio_rpc_client::connected,
                                 self,
                                 req,
                                 when_done,
                                 send_timeout_ms,
                                 std::placeholders::_1,
                                 std::placeholders::_2 ) );
            } else {
                ptr<resp_msg> rsp;
                ptr<rpc_exception> except
                   ( cs_new<rpc_exception>
                           ( lstrfmt("failed to resolve host %s "
                                     "due to error %d, %s")
                                    .fmt( host.c_str(),
                                          err.value(),
                                          err.message().c_str() ),
                             req ) );
                when_done(rsp, except);
            }
        } );
    }